

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightLeSample> * __thiscall
pbrt::GoniometricLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,GoniometricLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  undefined8 uVar1;
  uintptr_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  Point2f p;
  undefined1 auVar7 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  undefined1 extraout_var [56];
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  Vector3f VVar19;
  SampledSpectrum SVar20;
  Point3fi o;
  Float pdf;
  uint local_bc;
  float fStack_b8;
  Point3fi local_98;
  undefined1 local_78 [16];
  float local_5c;
  undefined1 local_58 [16];
  Tuple2<pbrt::Point2,_float> local_48;
  Point3fi local_40;
  undefined1 auVar9 [64];
  undefined1 auVar14 [56];
  
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  local_48 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar8._0_16_);
  p = PiecewiseConstant2D::Sample(&this->distrib,(Point2f *)&local_48,&local_5c);
  auVar11 = extraout_var;
  VVar19 = EqualAreaSquareToSphere(p);
  auVar9._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar11;
  uVar2 = (this->super_LightBase).mediumInterface.outside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_58 = auVar9._0_16_;
  uVar1 = vmovlps_avx(local_58);
  local_bc = (uint)uVar1;
  local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(ZEXT816(0),ZEXT816(0));
  local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(ZEXT816(0));
  fStack_b8 = (float)((ulong)uVar1 >> 0x20);
  Transform::operator()(&local_98,&(this->super_LightBase).renderFromLight,&local_40);
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fStack_b8 *
                                         (this->super_LightBase).renderFromLight.m.m[0][1])),
                           ZEXT416(local_bc),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fStack_b8 *
                                         (this->super_LightBase).renderFromLight.m.m[1][1])),
                           ZEXT416(local_bc),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fStack_b8 *
                                          (this->super_LightBase).renderFromLight.m.m[2][1])),
                            ZEXT416(local_bc),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
  local_78 = vfmadd231ss_fma(auVar5,ZEXT416((uint)VVar19.super_Tuple3<pbrt::Vector3,_float>.z),
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)VVar19.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  auVar5 = vfmadd231ss_fma(auVar12,ZEXT416((uint)VVar19.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  fVar17 = auVar4._0_4_;
  fVar18 = local_78._0_4_;
  fVar15 = auVar5._0_4_;
  fVar6 = fVar17 * fVar17 + fVar18 * fVar18 + fVar15 * fVar15;
  auVar12._0_12_ = ZEXT812(0);
  auVar12._12_4_ = 0;
  if (0.0 < fVar6) {
    auVar16._8_4_ = 0x7fffffff;
    auVar16._0_8_ = 0x7fffffff7fffffff;
    auVar16._12_4_ = 0x7fffffff;
    auVar3 = vandps_avx(local_78,auVar16);
    auVar7 = vandps_avx(auVar4,auVar16);
    auVar5 = vandps_avx(auVar5,auVar16);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ * 0.0)),auVar12,auVar7);
    auVar5 = vfmadd231ss_fma(auVar3,auVar12,auVar5);
    fVar6 = auVar5._0_4_ / fVar6;
    auVar5 = vinsertps_avx(ZEXT416((uint)(fVar17 * fVar6)),ZEXT416((uint)(fVar18 * fVar6)),0x10);
    uVar1 = vmovlps_avx(auVar5);
    local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
         fVar15 * fVar6;
    local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low =
         (Float)(int)uVar1;
    local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high =
         (Float)(int)((ulong)uVar1 >> 0x20);
    Point3fi::operator+=(&local_98,(Vector3<float> *)&local_40);
  }
  auVar12 = local_58;
  auVar4 = vinsertps_avx(auVar4,local_78,0x10);
  auVar3._4_4_ = local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                 high;
  auVar3._8_4_ = local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                 low;
  auVar3._0_4_ = local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                 low;
  auVar3._12_4_ =
       local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  auVar5 = vinsertps_avx(auVar3,ZEXT416((uint)local_98.super_Point3<pbrt::Interval>.
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                         0x10);
  auVar7._0_4_ = local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                 high + auVar5._0_4_;
  auVar7._4_4_ = local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                 low + auVar5._4_4_;
  auVar7._8_4_ = auVar5._8_4_ + 0.0;
  auVar7._12_4_ = auVar5._12_4_ + 0.0;
  auVar5._8_4_ = 0x3f000000;
  auVar5._0_8_ = 0x3f0000003f000000;
  auVar5._12_4_ = 0x3f000000;
  local_78 = vmulps_avx512vl(auVar7,auVar5);
  VVar19.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_58._0_4_;
  VVar19.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_58._4_4_;
  auVar14 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
  auVar11 = ZEXT856((ulong)local_58._8_8_);
  local_58 = auVar12;
  SVar20 = I(this,VVar19,lambda);
  auVar13._0_8_ = SVar20.values.values._8_8_;
  auVar13._8_56_ = auVar14;
  auVar10._0_8_ = SVar20.values.values._0_8_;
  auVar10._8_56_ = auVar11;
  auVar5 = vmovlhps_avx(auVar10._0_16_,auVar13._0_16_);
  __return_storage_ptr__->set = true;
  *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar5;
  uVar1 = vmovlps_avx(local_78);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       (local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
       0.5;
  uVar1 = vmovlps_avx(auVar4);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = fVar15;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = time;
  *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar2;
  (__return_storage_ptr__->optionalValue).__data[0x88] = '\0';
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0x3f800000;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x94) = local_5c / 12.566371;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> GoniometricLight::SampleLe(Point2f u1, Point2f u2,
                                                         SampledWavelengths &lambda,
                                                         Float time) const {
    // Sample direction and PDF for ray leaving goniometric light
    Float pdf;
    Point2f uv = distrib.Sample(u1, &pdf);
    Vector3f wl = EqualAreaSquareToSphere(uv);
    Float pdfDir = pdf / (4 * Pi);

    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.outside));
    return LightLeSample(I(wl, lambda), ray, 1, pdfDir);
}